

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.h
# Opt level: O2

void __thiscall
program_options::too_many_positional_options_error::too_many_positional_options_error
          (too_many_positional_options_error *this)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "too many positional options have been specified on the command line",&local_31);
  error::error(&this->super_error,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)&this->super_error = &PTR__logic_error_0017d978;
  return;
}

Assistant:

too_many_positional_options_error()
     : error("too many positional options have been specified on the command line")
    {}